

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall Loop::InsertLandingPad(Loop *this,FlowGraph *fg)

{
  IRKind IVar1;
  uint uVar2;
  Instr *pIVar3;
  bool bVar4;
  BasicBlock *blockSucc;
  BasicBlock *pBVar5;
  LabelInstr *pLVar6;
  LabelInstr *pLVar7;
  Type *ppBVar8;
  Type *ppFVar9;
  long lVar10;
  BranchInstr *this_00;
  Func **ppFVar11;
  Loop *pLVar12;
  BasicBlock *pBVar13;
  undefined1 local_60 [8];
  EditingIterator iter;
  BasicBlock *local_38;
  BasicBlock *landingPad;
  
  blockSucc = GetHeadBlock(this);
  pBVar5 = BasicBlock::New(fg);
  this->landingPad = pBVar5;
  pIVar3 = blockSucc->firstInstr;
  local_38 = pBVar5;
  pLVar6 = IR::LabelInstr::New(Label,pIVar3->m_func,false);
  IR::Instr::SetByteCodeOffset(&pLVar6->super_Instr,pIVar3);
  IR::Instr::InsertBefore(pIVar3,&pLVar6->super_Instr);
  IR::LabelInstr::SetBasicBlock(pLVar6,pBVar5);
  pLVar7 = IR::Instr::AsLabelInstr(blockSucc->firstInstr);
  pLVar6->m_region = pLVar7->m_region;
  pLVar7 = IR::Instr::AsLabelInstr(blockSucc->firstInstr);
  pLVar6->field_0x78 = pLVar6->field_0x78 & 0xfb | pLVar7->field_0x78 & 4;
  uVar2 = fg->blockCount;
  fg->blockCount = uVar2 + 1;
  pBVar5->number = uVar2;
  pBVar5->firstInstr = &pLVar6->super_Instr;
  pBVar13 = blockSucc->prev;
  pBVar5->prev = pBVar13;
  pBVar13->next = pBVar5;
  pBVar5->next = blockSucc;
  blockSucc->prev = pBVar5;
  pLVar12 = this->parent;
  pBVar5->loop = pLVar12;
  iter.last = (NodeBase *)pLVar6;
  do {
    if (pLVar12 == (Loop *)0x0) {
      local_60 = (undefined1  [8])&blockSucc->predList;
      iter.super_Iterator.current = (NodeBase *)0x0;
      iter.super_Iterator.list =
           (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_60;
      while( true ) {
        bVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                          ((EditingIterator *)local_60);
        if (!bVar4) break;
        ppFVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)local_60);
        pBVar13 = (*ppFVar9)->predBlock;
        if (pBVar13->loop != this) {
          bVar4 = IsDescendentOrSelf(this,pBVar13->loop);
          if (!bVar4) {
            pBVar5 = pBVar13->next;
            ppFVar11 = (Func **)&pBVar5->firstInstr;
            if (pBVar5 == (BasicBlock *)0x0) {
              ppFVar11 = &pBVar13->func;
            }
            lVar10 = 0x18;
            if (pBVar5 == (BasicBlock *)0x0) {
              lVar10 = 0xd0;
            }
            pIVar3 = *(Instr **)((long)&(*ppFVar11)->m_alloc + lVar10);
            if ((pIVar3->m_kind == InstrKindBranch) &&
               ((IVar1 = blockSucc->firstInstr->m_kind, IVar1 == InstrKindProfiledLabel ||
                (IVar1 == InstrKindLabel)))) {
              this_00 = IR::Instr::AsBranchInstr(pIVar3);
              pLVar6 = IR::Instr::AsLabelInstr(blockSucc->firstInstr);
              IR::BranchInstr::ReplaceTarget(this_00,pLVar6,(LabelInstr *)iter.last);
              pBVar13 = (*ppFVar9)->predBlock;
            }
            BasicBlock::UnlinkPred(blockSucc,pBVar13,false);
            BasicBlock::AddPred(local_38,*ppFVar9,fg);
            (*ppFVar9)->succBlock = local_38;
          }
        }
      }
      FlowGraph::AddEdge(fg,local_38,blockSucc);
      pLVar6 = IR::Instr::AsLabelInstr(blockSucc->firstInstr);
      if (pLVar6->m_region != (Region *)0x0) {
        pLVar6 = IR::Instr::AsLabelInstr(blockSucc->firstInstr);
        if (pLVar6->m_region->type != RegionTypeRoot) {
          *(byte *)&iter.last[0xf].next = *(byte *)&iter.last[0xf].next | 4;
        }
      }
      return;
    }
    local_60 = (undefined1  [8])&pLVar12->blockList;
    iter.super_Iterator.current = (NodeBase *)0x0;
    iter.super_Iterator.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_60;
    do {
      bVar4 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)local_60);
      if (!bVar4) goto LAB_003fa0a9;
      ppBVar8 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_60);
    } while ((*ppBVar8 != blockSucc) || ((*(ushort *)&(*ppBVar8)->field_0x18 & 1) != 0));
    SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::InsertBefore
              ((EditingIterator *)local_60,&local_38);
LAB_003fa0a9:
    pLVar12 = pLVar12->parent;
  } while( true );
}

Assistant:

void
Loop::InsertLandingPad(FlowGraph *fg)
{
    BasicBlock *headBlock = this->GetHeadBlock();

    // Always create a landing pad.  This allows globopt to easily hoist instructions
    // and re-optimize the block if needed.
    BasicBlock *landingPad = BasicBlock::New(fg);
    this->landingPad = landingPad;
    IR::Instr * headInstr = headBlock->GetFirstInstr();
    IR::LabelInstr *landingPadLabel = IR::LabelInstr::New(Js::OpCode::Label, headInstr->m_func);
    landingPadLabel->SetByteCodeOffset(headInstr);
    headInstr->InsertBefore(landingPadLabel);

    landingPadLabel->SetBasicBlock(landingPad);
    landingPadLabel->SetRegion(headBlock->GetFirstInstr()->AsLabelInstr()->GetRegion());
    landingPadLabel->m_hasNonBranchRef = headBlock->GetFirstInstr()->AsLabelInstr()->m_hasNonBranchRef;
    landingPad->SetBlockNum(fg->blockCount++);
    landingPad->SetFirstInstr(landingPadLabel);
    landingPad->SetLastInstr(landingPadLabel);

    landingPad->prev = headBlock->prev;
    landingPad->prev->next = landingPad;
    landingPad->next = headBlock;
    headBlock->prev = landingPad;

    Loop *parentLoop = this->parent;
    landingPad->loop = parentLoop;

    // We need to add this block to the block list of the parent loops
    while (parentLoop)
    {
        // Find the head block in the block list of the parent loop
        FOREACH_BLOCK_IN_LOOP_EDITING(block, parentLoop, iter)
        {
            if (block == headBlock)
            {
                // Add the landing pad to the block list
                iter.InsertBefore(landingPad);
                break;
            }
        } NEXT_BLOCK_IN_LOOP_EDITING;

        parentLoop = parentLoop->parent;
    }

    // Fix predecessor flow edges
    FOREACH_PREDECESSOR_EDGE_EDITING(edge, headBlock, iter)
    {
        // Make sure it isn't a back-edge
        if (edge->GetPred()->loop != this && !this->IsDescendentOrSelf(edge->GetPred()->loop))
        {
            if (edge->GetPred()->GetLastInstr()->IsBranchInstr() && headBlock->GetFirstInstr()->IsLabelInstr())
            {
                IR::BranchInstr *branch = edge->GetPred()->GetLastInstr()->AsBranchInstr();
                branch->ReplaceTarget(headBlock->GetFirstInstr()->AsLabelInstr(), landingPadLabel);
            }
            headBlock->UnlinkPred(edge->GetPred(), false);
            landingPad->AddPred(edge, fg);
            edge->SetSucc(landingPad);
        }
    } NEXT_PREDECESSOR_EDGE_EDITING;

    fg->AddEdge(landingPad, headBlock);

    if (headBlock->GetFirstInstr()->AsLabelInstr()->GetRegion() && headBlock->GetFirstInstr()->AsLabelInstr()->GetRegion()->GetType() != RegionTypeRoot)
    {
        landingPadLabel->m_hasNonBranchRef = true;
    }
}